

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
ptc::osout<char>(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                 *__return_storage_ptr__,basic_ostream<char,_std::char_traits<char>_> *os)

{
  undefined8 first;
  basic_streambuf<char,_std::char_traits<char>_> *sbuf_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  undefined1 local_278 [8];
  savebuf<char> sbuf;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> str;
  basic_streambuf<char,_std::char_traits<char>_> *buf;
  Print<char> printer;
  basic_ostream<char,_std::char_traits<char>_> *os_local;
  
  printer._96_8_ = os;
  Print<char>::Print((Print<char> *)&buf);
  sbuf_00 = (basic_streambuf<char,_std::char_traits<char>_> *)std::ios::rdbuf();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(sbuf.save.field_2._M_local_buf + 8));
  savebuf<char>::savebuf((savebuf<char> *)local_278,sbuf_00);
  std::ios::rdbuf((streambuf *)(printer._96_8_ + *(long *)(*(long *)printer._96_8_ + -0x18)));
  first = printer._96_8_;
  std::__cxx11::ostringstream::str();
  Print<char>::operator()
            ((Print<char> *)&buf,(basic_ostream<char,_std::char_traits<char>_> *)first,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::ios::rdbuf((streambuf *)(printer._96_8_ + *(long *)(*(long *)printer._96_8_ + -0x18)));
  savebuf<char>::str_abi_cxx11_(__return_storage_ptr__,(savebuf<char> *)local_278);
  savebuf<char>::~savebuf((savebuf<char> *)local_278);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(sbuf.save.field_2._M_local_buf + 8))
  ;
  Print<char>::~Print((Print<char> *)&buf);
  return __return_storage_ptr__;
}

Assistant:

inline const std::basic_string<T> osout( std::basic_ostream<T>& os = select_cout<T>::cout, const Args&... args )
   {
    Print<T> printer;
    std::basic_streambuf<T>* buf = os.rdbuf();
    std::basic_ostringstream<T> str;

    savebuf<T> sbuf( buf );
    os.rdbuf( &sbuf );

    ( ( str << args << printer.getSep() ), ... );
    printer( os, str.str() );
    os.rdbuf( buf );
    return sbuf.str();
   }